

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::SocketHandler(CConnman *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  NodesSnapshot *this_00;
  CConnman *in_RDI;
  long in_FS_OFFSET;
  Span<CNode_*const> in_stack_00000020;
  milliseconds timeout;
  NodesSnapshot snap;
  EventsPerSock events_per_sock;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  *in_stack_fffffffffffffef0;
  Span<CNode_*const> *in_stack_fffffffffffffef8;
  byte local_e9;
  duration in_stack_ffffffffffffff28;
  EventsPerSock *in_stack_ffffffffffffff30;
  CConnman *this_01;
  undefined1 in_stack_ffffffffffffff47;
  CConnman *in_stack_ffffffffffffff48;
  NodesSnapshot *in_stack_ffffffffffffff50;
  undefined1 local_40 [16];
  __node_base in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffeec,(Mutex *)0x210f83);
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::unordered_map((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                   *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  NodesSnapshot::NodesSnapshot
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(bool)in_stack_ffffffffffffff47);
  NodesSnapshot::Nodes
            ((NodesSnapshot *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Span<CNode*const>::Span<std::vector<CNode*,std::allocator<CNode*>>>
            (in_stack_fffffffffffffef8,
             (vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffef0,
             (type)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  GenerateWaitSockets((CConnman *)in_stack_ffffffffffffffd0._M_nxt,in_stack_00000020);
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::operator=((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
               *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::~unordered_map((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  bVar2 = std::
          unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
          ::empty((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                   *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_e9 = 1;
  if (!bVar2) {
    std::
    unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
    ::begin(in_stack_fffffffffffffef0);
    std::__detail::
    _Node_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>::
    operator->((_Node_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    peVar4 = std::__shared_ptr_access<const_Sock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Sock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    iVar3 = (*peVar4->_vptr_Sock[0xf])(peVar4,0x32,local_40);
    local_e9 = (byte)iVar3 ^ 0xff;
  }
  if ((local_e9 & 1) != 0) {
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffef0,
               (duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    CThreadInterrupt::sleep_for((CThreadInterrupt *)in_RDI,in_stack_ffffffffffffff28);
  }
  this_00 = (NodesSnapshot *)
            NodesSnapshot::Nodes
                      ((NodesSnapshot *)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  SocketHandlerConnected
            (in_RDI,(vector<CNode_*,_std::allocator<CNode_*>_> *)this_00,(EventsPerSock *)local_40);
  NodesSnapshot::~NodesSnapshot(this_00);
  SocketHandlerListening(this_01,in_stack_ffffffffffffff30);
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::~unordered_map((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                    *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandler()
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    Sock::EventsPerSock events_per_sock;

    {
        const NodesSnapshot snap{*this, /*shuffle=*/false};

        const auto timeout = std::chrono::milliseconds(SELECT_TIMEOUT_MILLISECONDS);

        // Check for the readiness of the already connected sockets and the
        // listening sockets in one call ("readiness" as in poll(2) or
        // select(2)). If none are ready, wait for a short while and return
        // empty sets.
        events_per_sock = GenerateWaitSockets(snap.Nodes());
        if (events_per_sock.empty() || !events_per_sock.begin()->first->WaitMany(timeout, events_per_sock)) {
            interruptNet.sleep_for(timeout);
        }

        // Service (send/receive) each of the already connected nodes.
        SocketHandlerConnected(snap.Nodes(), events_per_sock);
    }

    // Accept new connections from listening sockets.
    SocketHandlerListening(events_per_sock);
}